

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O0

void __thiscall vigra::BmpDecoderImpl::read_8bit_data(BmpDecoderImpl *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  value_type *pvVar4;
  void_vector<unsigned_char> *in_RDI;
  uint i;
  UInt8 *map_base;
  int index;
  int x;
  int y;
  UInt8 *mover;
  UInt8 *base;
  uint pad_size;
  uint image_size;
  uint line_size;
  uint ncomp;
  size_type in_stack_ffffffffffffffa8;
  uint local_44;
  int local_30;
  int local_2c;
  value_type *local_28;
  value_type *local_20;
  _Ios_Seekdir local_18;
  
  uVar1 = 3;
  if (((ulong)in_RDI[0x1a].super_void_vector_base.m_data & 0x100000000) != 0) {
    uVar1 = 1;
  }
  uVar2 = (int)in_RDI[0x16].super_void_vector_base.m_size * uVar1;
  iVar3 = *(int *)((long)&in_RDI[0x16].super_void_vector_base.m_size + 4);
  std::istream::seekg((long)in_RDI,*(_Ios_Seekdir *)&in_RDI[0x16].super_void_vector_base.m_data);
  void_vector<unsigned_char>::resize(in_RDI,in_stack_ffffffffffffffa8);
  local_18 = (int)in_RDI[0x16].super_void_vector_base.m_size % 4;
  if (local_18 != _S_beg) {
    local_18 = 4 - local_18;
  }
  local_20 = void_vector<unsigned_char>::data((void_vector<unsigned_char> *)0x14fcdd);
  local_20 = local_20 + iVar3 * uVar2;
  local_2c = *(int *)((long)&in_RDI[0x16].super_void_vector_base.m_size + 4);
  while (local_2c = local_2c + -1, -1 < local_2c) {
    local_20 = local_20 + -(ulong)uVar2;
    local_28 = local_20;
    for (local_30 = 0; local_30 < (int)in_RDI[0x16].super_void_vector_base.m_size;
        local_30 = local_30 + 1) {
      iVar3 = std::istream::get();
      pvVar4 = void_vector<unsigned_char>::data((void_vector<unsigned_char> *)0x14fd73);
      for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
        local_28[local_44] = pvVar4[(ulong)local_44 + (long)(iVar3 * 3)];
      }
      local_28 = local_28 + uVar1;
    }
    std::istream::seekg((long)in_RDI,local_18);
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_8bit_data ()
{
    // these are sizes for the final image
    const unsigned int ncomp = grayscale ? 1 : 3;
    const unsigned int line_size = info_header.width * ncomp;
    const unsigned int image_size = info_header.height * line_size;

    // seek to the data
    stream.seekg( file_header.offset, std::ios::beg );

    // make room for the pixels
    pixels.resize(image_size);

    // padding after each line (must end on a 32-bit boundary)
    unsigned int pad_size = info_header.width % 4;
    if ( pad_size > 0 )
        pad_size = 4 - pad_size;

    // setup the base pointer at one line after the end
    UInt8 * base = pixels.data() + image_size;
    UInt8 * mover = base;

    // read scanlines from bottom to top
    for ( int y = info_header.height - 1; y >= 0; --y ) {

        // set the base pointer to the beginning of the line to be read
        base -= line_size;
        mover = base;

        // read the line from left to right
        for ( int x = 0; x < info_header.width; ++x ) {

            // get the color byte
            const int index = stream.get();

            // map and assign the pixel
            const UInt8 * map_base = map.data() + 3 * index;
            for ( unsigned int i = 0; i < ncomp; ++i )
                mover[i] = map_base[i];
            mover += ncomp;
        }

        // advance to the next 32 bit boundary
        stream.seekg( pad_size, std::ios::cur );
    }
}